

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int renameColumnExprCb(Walker *pWalker,Expr *pExpr)

{
  RenameCtx *pRVar1;
  RenameToken *pRVar2;
  RenameToken *pRVar3;
  Parse *pPVar4;
  RenameToken **ppRVar5;
  
  pRVar1 = (pWalker->u).pRename;
  if (pExpr->op == 0xa2) {
    if (pRVar1->iCol != (int)pExpr->iColumn) {
      return 0;
    }
    if (pRVar1->pTab != (pExpr->y).pTab) {
      return 0;
    }
    pPVar4 = pWalker->pParse;
    pRVar2 = pPVar4->pRename;
    if (pRVar2 == (RenameToken *)0x0) {
      return 0;
    }
    if ((Expr *)pRVar2->p != pExpr) {
      do {
        pRVar3 = pRVar2;
        pRVar2 = pRVar3->pNext;
        if (pRVar2 == (RenameToken *)0x0) {
          return 0;
        }
      } while ((Expr *)pRVar2->p != pExpr);
      goto LAB_001bfaa4;
    }
  }
  else {
    if (pExpr->op != 'M') {
      return 0;
    }
    if (pRVar1->iCol != (int)pExpr->iColumn) {
      return 0;
    }
    pPVar4 = pWalker->pParse;
    if (pPVar4->pTriggerTab != pRVar1->pTab) {
      return 0;
    }
    pRVar2 = pPVar4->pRename;
    if (pRVar2 == (RenameToken *)0x0) {
      return 0;
    }
    if ((Expr *)pRVar2->p != pExpr) {
      do {
        pRVar3 = pRVar2;
        pRVar2 = pRVar3->pNext;
        if (pRVar2 == (RenameToken *)0x0) {
          return 0;
        }
      } while ((Expr *)pRVar2->p != pExpr);
LAB_001bfaa4:
      ppRVar5 = &pRVar3->pNext;
      goto LAB_001bfab1;
    }
  }
  ppRVar5 = &pPVar4->pRename;
LAB_001bfab1:
  *ppRVar5 = pRVar2->pNext;
  pRVar2->pNext = pRVar1->pList;
  pRVar1->pList = pRVar2;
  pRVar1->nList = pRVar1->nList + 1;
  return 0;
}

Assistant:

static int renameColumnExprCb(Walker *pWalker, Expr *pExpr){
  RenameCtx *p = pWalker->u.pRename;
  if( pExpr->op==TK_TRIGGER 
   && pExpr->iColumn==p->iCol 
   && pWalker->pParse->pTriggerTab==p->pTab
  ){
    renameTokenFind(pWalker->pParse, p, (void*)pExpr);
  }else if( pExpr->op==TK_COLUMN 
   && pExpr->iColumn==p->iCol 
   && p->pTab==pExpr->y.pTab
  ){
    renameTokenFind(pWalker->pParse, p, (void*)pExpr);
  }
  return WRC_Continue;
}